

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O3

void __thiscall
nvim::NvimRPC::call<bool,bool>(NvimRPC *this,string *method,Integer *res,bool *u,bool *u_1)

{
  bool bVar1;
  uint64_t *puVar2;
  ostream *poVar3;
  ext *peVar4;
  long *plVar5;
  uint64_t uVar6;
  Object v;
  variant<_cf2d41c5_> vStack_58;
  string local_30;
  
  do_call<bool,bool>((Object *)&vStack_58,this,method,u,u_1);
  bVar1 = msgpack::v1::type::
          basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
          ::is_int64_t((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                        *)&vStack_58);
  if (bVar1) {
    puVar2 = (uint64_t *)
             msgpack::v1::type::
             basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
             ::as_int64_t((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                           *)&vStack_58);
LAB_00196e61:
    uVar6 = *puVar2;
  }
  else {
    bVar1 = msgpack::v1::type::
            basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
            ::is_uint64_t((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                           *)&vStack_58);
    if (bVar1) {
      puVar2 = msgpack::v1::type::
               basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
               ::as_uint64_t((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                              *)&vStack_58);
      goto LAB_00196e61;
    }
    bVar1 = msgpack::v1::type::
            basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
            ::is_ext((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                      *)&vStack_58);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"invalid response type",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      goto LAB_00196e67;
    }
    type_name(&local_30,(Object *)&vStack_58);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_30._M_dataplus._M_p,local_30._M_string_length);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    peVar4 = msgpack::v1::type::
             basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
             ::as_ext((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                       *)&vStack_58);
    plVar5 = (long *)std::ostream::operator<<
                               (&std::cout,
                                (int)*(peVar4->m_data).
                                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_start);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    msgpack::v1::type::
    basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
    ::as_ext((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
              *)&vStack_58);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    peVar4 = msgpack::v1::type::
             basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
             ::as_ext((basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
                       *)&vStack_58);
    uVar6 = (uint64_t)
            (peVar4->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[1];
  }
  *res = uVar6;
LAB_00196e67:
  boost::variant<$cf2d41c5$>::destroy_content(&vStack_58);
  return;
}

Assistant:

void NvimRPC::call(const std::string &method, Integer& res, const U& ...u) {
    Object v = do_call(method, u...);
    // std::cout << "Integer NvimRPC::call" << std::endl;

    // int64_t is only for negative integer.
    if(v.is_int64_t())       res = v.as_int64_t();
    else if(v.is_uint64_t()) res = v.as_uint64_t();
    else if (v.is_ext()) {
        // NOTE: Buffer: 0; Tabpage: 2; Window: 1
        std::cout << type_name(v) << std::endl;
        std::cout << int(v.as_ext().type()) << std::endl;
        std::cout << v.as_ext().size() << std::endl;
        res = int(v.as_ext().data()[0]);
    }
    else std::cout << "invalid response type" << std::endl; //TODO: add error handler
}